

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O1

void __thiscall
cpp_properties::
cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
::cpp_properties_lexer
          (cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lexer_def *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  *plVar4;
  lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
  *plVar5;
  cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
  *pcVar6;
  char_type *pcVar7;
  long *local_578 [2];
  long local_568 [2];
  string local_558;
  long *local_538 [2];
  long local_528 [2];
  string local_518;
  string local_4f8;
  long *local_4d8 [2];
  long local_4c8 [2];
  string local_4b8;
  long *local_498 [2];
  long local_488 [2];
  string local_478;
  long *local_458 [2];
  long local_448 [2];
  string local_438;
  long *local_418 [2];
  long local_408 [2];
  string local_3f8;
  long *local_3d8 [2];
  long local_3c8 [2];
  string local_3b8;
  long *local_398 [2];
  long local_388 [2];
  string local_378;
  long *local_358 [2];
  long local_348 [2];
  string local_338;
  long *local_318 [2];
  long local_308 [2];
  string local_2f8;
  long *local_2d8 [2];
  long local_2c8 [2];
  string local_2b8;
  long *local_298 [2];
  long local_288 [2];
  string local_278;
  long *local_258 [2];
  long local_248 [2];
  string local_238;
  long *local_218 [2];
  long local_208 [2];
  string local_1f8;
  long *local_1d8 [2];
  long local_1c8 [2];
  string local_1b8;
  string_type local_198;
  string local_178;
  string_type local_158;
  string local_138;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_118;
  string_type local_b8;
  cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
  *local_98;
  string local_90;
  string local_70;
  string_type local_50;
  
  boost::spirit::lex::
  lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
  ::lexer(&this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
          ,0);
  local_118.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::lex::reference<const_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>,_boost::spirit::unused_type>_>,_0L>,_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.
  super_reference<const_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>_>
  .ref.t_ = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::lex::reference<const_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>,_boost::spirit::unused_type>_>,_0L>
             )&local_118.add_pattern;
  local_98 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"cr","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\\r","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,
             (char *)local_118.
                     super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::lex::reference<const_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>,_boost::spirit::unused_type>_>,_0L>,_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>,_boost::proto::domainns_::default_domain,_0L>
                     .proto_expr_.child0.
                     super_reference<const_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>_>
                     .ref.t_,&local_70);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"lf","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\\n","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,local_50._M_dataplus._M_p,&local_90);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"eol","");
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"\\r\\n","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,local_b8._M_dataplus._M_p,&local_178);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"lb_cr","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"\\\\\\r[ \\f\\t]*","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,local_158._M_dataplus._M_p,&local_138);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"lb_lf","");
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"\\\\\\n[ \\f\\t]*","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,local_198._M_dataplus._M_p,&local_4f8);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_4d8[0] = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"lb_eol","");
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"\\\\\\r\\n[ \\f\\t]*","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_4d8[0],&local_4b8);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"spaces","");
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"[ \\f\\t]+","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_498[0],&local_478);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"sharp","");
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"#","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_458[0],&local_438);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"exclamation","");
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"!","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_418[0],&local_3f8);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_3d8[0] = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"comment","");
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"[^ \\f\\t\\r\\n]+","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_3d8[0],&local_3b8);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_398[0] = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"colon","");
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,":","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_398[0],&local_378);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_358[0] = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"equal","");
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"=","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_358[0],&local_338);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"backslash","");
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"\\\\","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_318[0],&local_2f8);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"first_key","");
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,"[^ \\f\\t\\r\\n\\\\=:#!][^ \\f\\t\\r\\n\\\\=:]*","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_2d8[0],&local_2b8);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"key","");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"[^ \\f\\t\\r\\n\\\\=:]+","")
  ;
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_298[0],&local_278);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"blank_value","");
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"[^ \\f\\t\\r\\n\\\\=:][^ \\f\\t\\r\\n\\\\]*","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_258[0],&local_238);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"value","");
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"[^ \\f\\t\\r\\n\\\\]+","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_218[0],&local_1f8);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"unicode","");
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"\\\\u[0-9a-fA-F]{4}","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_1d8[0],&local_1b8);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_578[0] = local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"bad_unicode","");
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"\\\\u[0-9a-fA-F]{0,3}","");
  plVar4 = (this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_578[0],&local_558);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  local_538[0] = local_528;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"escape","");
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"\\\\[^\\r\\n]","");
  plVar4 = (local_98->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           ).self.add_pattern.def;
  plVar5 = plVar4->def;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_state(&plVar5->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,(plVar4->state)._M_dataplus._M_p);
  boost::lexer::basic_rules<char>::add_macro
            (&(plVar5->
              super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ).rules_,(char *)local_538[0],&local_518);
  (plVar5->
  super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ).initialized_dfa_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if (local_538[0] != local_528) {
    operator_delete(local_538[0],local_528[0] + 1);
  }
  pcVar6 = local_98;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  if (local_578[0] != local_568) {
    operator_delete(local_578[0],local_568[0] + 1);
  }
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0],local_2c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if (local_358[0] != local_348) {
    operator_delete(local_358[0],local_348[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if (local_3d8[0] != local_3c8) {
    operator_delete(local_3d8[0],local_3c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if (local_418[0] != local_408) {
    operator_delete(local_418[0],local_408[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if (local_4d8[0] != local_4c8) {
    operator_delete(local_4d8[0],local_4c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(pcVar6->
             super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
             ).self;
  if (local_118.
      super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::lex::reference<const_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>,_boost::spirit::unused_type>_>,_0L>,_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>,_boost::proto::domainns_::default_domain,_0L>
      .proto_expr_.child0.
      super_reference<const_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>_>
      .ref.t_ !=
      (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::lex::reference<const_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>,_boost::spirit::unused_type>_>,_0L>
       )&local_118.add_pattern) {
    operator_delete((void *)local_118.
                            super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::lex::reference<const_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>,_boost::spirit::unused_type>_>,_0L>,_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>,_boost::proto::domainns_::default_domain,_0L>
                            .proto_expr_.child0.
                            super_reference<const_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>_>
                            .ref.t_,
                    (ulong)((long)&((local_118.add_pattern.def)->
                                   super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::lex::reference<const_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>,_boost::spirit::unused_type>_>,_0L>,_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>,_boost::proto::domainns_::default_domain,_0L>
                                   ).proto_expr_.child0.
                                   super_reference<const_boost::spirit::lex::detail::lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>_>
                                   .ref.t_ + 1));
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"INITIAL");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{spaces}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,1000,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{cr}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x3e9,pcVar7);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{lf}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_90,0x3ea,pcVar7);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"{eol}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_b8,0x3eb,pcVar7);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"{lb_cr}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_178,0x3ec,pcVar7);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"{lb_lf}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_158,0x3ed,pcVar7);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"{lb_eol}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_138,0x3ee,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_118.targetstate.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_118.state.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"INITIAL","COMMENT");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{sharp}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x3ef,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{exclamation}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x3f0,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"COMMENT");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{comment}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x3f1,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{spaces}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x3f2,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"COMMENT","INITIAL");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{cr}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x3f3,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{lf}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x3f4,pcVar7);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{eol}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_90,0x3f5,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"INITIAL","KEY");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{first_key}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x3f6,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{escape}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x3f7,pcVar7);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{unicode}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_90,0x3f8,pcVar7);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"{bad_unicode}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_b8,0x3f9,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"KEY");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{key}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x3f6,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{escape}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x3f7,pcVar7);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{unicode}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_90,0x3f8,pcVar7);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"{lb_cr}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_b8,0x3fd,pcVar7);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"{lb_lf}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_178,0x3fe,pcVar7);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"{lb_eol}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_158,0x3ff,pcVar7);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"{bad_unicode}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_138,0x3f9,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"KEY","INITIAL");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{cr}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x3fa,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{lf}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x3fb,pcVar7);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{eol}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_90,0x3fc,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"KEY","SEPARATOR");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{colon}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x400,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{equal}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x401,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"KEY","BLANK_SEPARATOR");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{spaces}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x402,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"BLANK_SEPARATOR");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{lb_cr}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x406,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{lb_lf}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x407,pcVar7);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{lb_eol}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_90,0x408,pcVar7);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"{spaces}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_b8,0x402,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"BLANK_SEPARATOR","INITIAL");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{cr}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x403,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{lf}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x404,pcVar7);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{eol}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_90,0x405,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"BLANK_SEPARATOR","SEPARATOR");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{colon}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x400,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{equal}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x401,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"INITIAL","SEPARATOR");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{colon}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x400,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{equal}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x401,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"SEPARATOR","INITIAL");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{cr}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x403,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{lf}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x404,pcVar7);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{eol}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_90,0x405,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"SEPARATOR","VALUE");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{spaces}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x409,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{value}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x40a,pcVar7);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{escape}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_90,0x40b,pcVar7);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"{unicode}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_b8,0x40c,pcVar7);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"{lb_cr}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_178,0x411,pcVar7);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"{lb_lf}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_158,0x412,pcVar7);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"{lb_eol}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_138,0x413,pcVar7);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"{bad_unicode}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_198,0x40d,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"BLANK_SEPARATOR","VALUE");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{blank_value}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x40a,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{escape}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x40b,pcVar7);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{unicode}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_90,0x40c,pcVar7);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"{bad_unicode}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_b8,0x40d,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"VALUE");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{spaces}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x409,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{value}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x40a,pcVar7);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{escape}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_90,0x40b,pcVar7);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"{unicode}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_b8,0x40c,pcVar7);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"{lb_cr}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_178,0x411,pcVar7);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"{lb_lf}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_158,0x412,pcVar7);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"{lb_eol}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_138,0x413,pcVar7);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"{bad_unicode}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_198,0x40d,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_118,this_00,"VALUE","INITIAL");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{cr}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_70,0x40e,pcVar7);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{lf}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_50,0x40f,pcVar7);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{eol}","");
  if (((local_118.add.def)->targetstate)._M_string_length == 0) {
    pcVar7 = (char_type *)0x0;
  }
  else {
    pcVar7 = ((local_118.add.def)->targetstate)._M_dataplus._M_p;
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::add_token(&(local_118.add.def)->def->
               super_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
              ,((local_118.add.def)->state)._M_dataplus._M_p,&local_90,0x410,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.targetstate._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.targetstate._M_dataplus._M_p,
                    local_118.targetstate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.state._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.state._M_dataplus._M_p,
                    local_118.state.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cpp_properties_lexer()
    {
        using namespace token;
        this->self.add_pattern
            ("cr"          , "\\r")
            ("lf"          , "\\n")
            ("eol"         , "\\r\\n")

            ("lb_cr"       , "\\\\\\r[ \\f\\t]*")
            ("lb_lf"       , "\\\\\\n[ \\f\\t]*")
            ("lb_eol"      , "\\\\\\r\\n[ \\f\\t]*")

            ("spaces"      , "[ \\f\\t]+")

            ("sharp"       , "#")
            ("exclamation" , "!")
            ("comment"     , "[^ \\f\\t\\r\\n]+")

            ("colon"       , ":")
            ("equal"       , "=")

            ("backslash"   , "\\\\")
            ("first_key"   , "[^ \\f\\t\\r\\n\\\\=:#!][^ \\f\\t\\r\\n\\\\=:]*")
            ("key"         , "[^ \\f\\t\\r\\n\\\\=:]+")

            ("blank_value" , "[^ \\f\\t\\r\\n\\\\=:][^ \\f\\t\\r\\n\\\\]*")
            ("value"       , "[^ \\f\\t\\r\\n\\\\]+")

            ("unicode"     , "\\\\u[0-9a-fA-F]{4}")
            ("bad_unicode" , "\\\\u[0-9a-fA-F]{0,3}")
            ("escape"      , "\\\\[^\\r\\n]")
        ;

        this->self("INITIAL").add
            ("{spaces}"      , ID_SPACES)
            ("{cr}"          , ID_CR)
            ("{lf}"          , ID_LF)
            ("{eol}"         , ID_EOL)
            ("{lb_cr}"       , ID_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_LINE_BREAK_EOL)
        ;

        this->self("INITIAL", "COMMENT").add
            ("{sharp}"       , ID_COMMENT_SHARP)
            ("{exclamation}" , ID_COMMENT_EXCLAMATION)
        ;

        this->self("COMMENT").add
            ("{comment}"     , ID_COMMENT_CHARS)
            ("{spaces}"      , ID_COMMENT_SPACES)
        ;

        this->self("COMMENT", "INITIAL").add
            ("{cr}"          , ID_COMMENT_CR)
            ("{lf}"          , ID_COMMENT_LF)
            ("{eol}"         , ID_COMMENT_EOL)
        ;

        this->self("INITIAL", "KEY").add
            ("{first_key}"   , ID_KEY_CHARS)
            ("{escape}"      , ID_KEY_ESCAPE_CHAR)
            ("{unicode}"     , ID_KEY_UNICODE)
            ("{bad_unicode}" , ID_KEY_BAD_UNICODE)
        ;

        this->self("KEY").add
            ("{key}"         , ID_KEY_CHARS)
            ("{escape}"      , ID_KEY_ESCAPE_CHAR)
            ("{unicode}"     , ID_KEY_UNICODE)
            ("{lb_cr}"       , ID_KEY_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_KEY_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_KEY_LINE_BREAK_EOL)
            ("{bad_unicode}" , ID_KEY_BAD_UNICODE)
        ;

        this->self("KEY", "INITIAL").add
            ("{cr}"          , ID_KEY_CR)
            ("{lf}"          , ID_KEY_LF)
            ("{eol}"         , ID_KEY_EOL)
        ;

        this->self("KEY", "SEPARATOR").add
            ("{colon}"       , ID_SEPARATOR_COLON)
            ("{equal}"       , ID_SEPARATOR_EQUAL)
        ;

        this->self("KEY", "BLANK_SEPARATOR").add
            ("{spaces}"      , ID_SEPARATOR_SPACES)
        ;

        this->self("BLANK_SEPARATOR").add
            ("{lb_cr}"       , ID_SEPARATOR_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_SEPARATOR_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_SEPARATOR_LINE_BREAK_EOL)
            ("{spaces}"      , ID_SEPARATOR_SPACES)
        ;

        this->self("BLANK_SEPARATOR", "INITIAL").add
            ("{cr}"          , ID_SEPARATOR_CR)
            ("{lf}"          , ID_SEPARATOR_LF)
            ("{eol}"         , ID_SEPARATOR_EOL)
        ;

        this->self("BLANK_SEPARATOR", "SEPARATOR").add
            ("{colon}"       , ID_SEPARATOR_COLON)
            ("{equal}"       , ID_SEPARATOR_EQUAL)
        ;

        this->self("INITIAL", "SEPARATOR").add
            ("{colon}"       , ID_SEPARATOR_COLON)
            ("{equal}"       , ID_SEPARATOR_EQUAL)
        ;

        this->self("SEPARATOR", "INITIAL").add
            ("{cr}"          , ID_SEPARATOR_CR)
            ("{lf}"          , ID_SEPARATOR_LF)
            ("{eol}"         , ID_SEPARATOR_EOL)
        ;

        this->self("SEPARATOR", "VALUE").add
            ("{spaces}"      , ID_VALUE_SPACES)
            ("{value}"       , ID_VALUE_CHARS)
            ("{escape}"      , ID_VALUE_ESCAPE_CHAR)
            ("{unicode}"     , ID_VALUE_UNICODE)
            ("{lb_cr}"       , ID_VALUE_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_VALUE_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_VALUE_LINE_BREAK_EOL)
            ("{bad_unicode}" , ID_VALUE_BAD_UNICODE)
        ;

        this->self("BLANK_SEPARATOR", "VALUE").add
            ("{blank_value}" , ID_VALUE_CHARS)
            ("{escape}"      , ID_VALUE_ESCAPE_CHAR)
            ("{unicode}"     , ID_VALUE_UNICODE)
            ("{bad_unicode}" , ID_VALUE_BAD_UNICODE)
        ;

        this->self("VALUE").add
            ("{spaces}"      , ID_VALUE_SPACES)
            ("{value}"       , ID_VALUE_CHARS)
            ("{escape}"      , ID_VALUE_ESCAPE_CHAR)
            ("{unicode}"     , ID_VALUE_UNICODE)
            ("{lb_cr}"       , ID_VALUE_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_VALUE_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_VALUE_LINE_BREAK_EOL)
            ("{bad_unicode}" , ID_VALUE_BAD_UNICODE)
        ;

        this->self("VALUE", "INITIAL").add
            ("{cr}"          , ID_VALUE_CR)
            ("{lf}"          , ID_VALUE_LF)
            ("{eol}"         , ID_VALUE_EOL)
        ;

    }